

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

int lzham::lzham_lib_z_deflate(lzham_z_streamp pStream,int flush)

{
  uint uVar1;
  uint uVar2;
  lzham_flush_t flush_type;
  lzham_compress_status_t lVar3;
  lzham_uint8 *pOut_buf;
  uint uVar4;
  int iVar5;
  lzham_uint8 *pIn_buf;
  uint uVar6;
  lzham_z_ulong lVar7;
  lzham_z_ulong lVar8;
  lzham_z_internal_state *p;
  size_t out_bytes;
  size_t in_bytes;
  lzham_z_ulong local_40;
  lzham_z_ulong local_38;
  
  iVar5 = -2;
  if (((pStream != (lzham_z_streamp)0x0) &&
      (p = pStream->state, (uint)flush < 5 && p != (lzham_z_internal_state *)0x0)) &&
     (pOut_buf = pStream->next_out, pOut_buf != (lzham_uint8 *)0x0)) {
    uVar6 = pStream->avail_out;
    iVar5 = -5;
    if (uVar6 != 0) {
      flush_type = LZHAM_SYNC_FLUSH;
      if (flush != 1) {
        flush_type = flush;
      }
      local_38 = pStream->total_in;
      local_40 = pStream->total_out;
      uVar4 = pStream->avail_in;
      pIn_buf = pStream->next_in;
      while( true ) {
        in_bytes = (size_t)uVar4;
        out_bytes = (size_t)uVar6;
        lVar3 = lzham_lib_compress2(p,pIn_buf,&in_bytes,pOut_buf,&out_bytes,flush_type);
        pIn_buf = pStream->next_in + (in_bytes & 0xffffffff);
        pStream->next_in = pIn_buf;
        uVar1 = pStream->avail_in;
        uVar2 = pStream->avail_out;
        uVar4 = uVar1 - (uint)in_bytes;
        pStream->avail_in = uVar4;
        lVar7 = (in_bytes & 0xffffffff) + pStream->total_in;
        pStream->total_in = lVar7;
        pOut_buf = pStream->next_out + (out_bytes & 0xffffffff);
        pStream->next_out = pOut_buf;
        uVar6 = uVar2 - (uint)out_bytes;
        pStream->avail_out = uVar6;
        lVar8 = (out_bytes & 0xffffffff) + pStream->total_out;
        pStream->total_out = lVar8;
        pStream->adler = (ulong)*(uint *)(p + 0xac8);
        if (LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE < lVar3) break;
        if (lVar3 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
          return 1;
        }
        if (uVar2 == (uint)out_bytes) {
          return 0;
        }
        if (uVar1 == (uint)in_bytes && flush_type != LZHAM_FINISH) {
          if (flush_type != LZHAM_NO_FLUSH) {
            return 0;
          }
          if (lVar7 != local_38) {
            return 0;
          }
          if (lVar8 != local_40) {
            return 0;
          }
          return -5;
        }
        p = pStream->state;
      }
      iVar5 = -2;
    }
  }
  return iVar5;
}

Assistant:

int lzham_lib_z_deflate(lzham_z_streamp pStream, int flush)
   {
      if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > LZHAM_Z_FINISH) || (!pStream->next_out))
      {
         LZHAM_LOG_ERROR(6037);
         return LZHAM_Z_STREAM_ERROR;
      }

      if (!pStream->avail_out)
      {
         LZHAM_LOG_ERROR(6038);
         return LZHAM_Z_BUF_ERROR;
      }

      if (flush == LZHAM_Z_PARTIAL_FLUSH)
         flush = LZHAM_Z_SYNC_FLUSH;

      int lzham_status = LZHAM_Z_OK;
      lzham_z_ulong orig_total_in = pStream->total_in, orig_total_out = pStream->total_out;
      for ( ; ; )
      {
         size_t in_bytes = pStream->avail_in, out_bytes = pStream->avail_out;

         lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
         lzham_compress_state *pState = static_cast<lzham_compress_state*>(pComp);

         lzham_compress_status_t status = lzham_lib_compress2(
            pComp,
            pStream->next_in, &in_bytes,
            pStream->next_out, &out_bytes,
            (lzham_flush_t)flush);

         pStream->next_in += (uint)in_bytes;
         pStream->avail_in -= (uint)in_bytes;
         pStream->total_in += (uint)in_bytes;

         pStream->next_out += (uint)out_bytes;
         pStream->avail_out -= (uint)out_bytes;
         pStream->total_out += (uint)out_bytes;

         pStream->adler = pState->m_compressor.get_src_adler32();

         if (status >= LZHAM_COMP_STATUS_FIRST_FAILURE_CODE)
         {
            lzham_status = LZHAM_Z_STREAM_ERROR;
            LZHAM_LOG_ERROR(6039);
            break;
         }
         else if (status == LZHAM_COMP_STATUS_SUCCESS)
         {
            lzham_status = LZHAM_Z_STREAM_END;
            break;
         }
         else if (!pStream->avail_out)
            break;
         else if ((!pStream->avail_in) && (flush != LZHAM_Z_FINISH))
         {
            if ((flush) || (pStream->total_in != orig_total_in) || (pStream->total_out != orig_total_out))
               break;
            LZHAM_LOG_ERROR(6040);
            return LZHAM_Z_BUF_ERROR; // Can't make forward progress without some input.
         }
      }
      return lzham_status;
   }